

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

RefPtr<wabt::interp::Module> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
          (RefPtr<wabt::interp::Module> *__return_storage_ptr__,Store *this,Store *args,
          ModuleDesc *args_1)

{
  Module *this_00;
  Ref ref;
  Module *local_158;
  ModuleDesc local_150;
  
  this_00 = (Module *)operator_new(400);
  local_150.func_types.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->func_types).
       super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_150.func_types.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->func_types).
       super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150.func_types.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->func_types).
       super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_1->func_types).
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->func_types).
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->func_types).
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.imports.
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->imports).
       super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_150.imports.
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->imports).
       super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_150.imports.
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->imports).
       super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->imports).
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->imports).
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->imports).
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.funcs.
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->funcs).
       super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_150.funcs.
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->funcs).
       super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150.funcs.
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->funcs).
       super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_1->funcs).
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->funcs).
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->funcs).
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.tables.
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->tables).
       super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_150.tables.
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->tables).
       super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_150.tables.
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->tables).
       super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (args_1->tables).
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->tables).
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->tables).
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.memories.
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->memories).
       super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_150.memories.
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->memories).
       super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_150.memories.
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->memories).
       super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->memories).
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->memories).
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->memories).
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.globals.
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->globals).
       super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_150.globals.
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->globals).
       super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_150.globals.
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->globals).
       super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->globals).
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->globals).
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->globals).
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.events.
  super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->events).
       super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_150.events.
  super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->events).
       super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_150.events.
  super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->events).
       super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (args_1->events).
  super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->events).
  super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->events).
  super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.exports.
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->exports).
       super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_150.exports.
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->exports).
       super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_150.exports.
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->exports).
       super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->exports).
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->exports).
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->exports).
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.starts.
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->starts).
       super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_150.starts.
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->starts).
       super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_150.starts.
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->starts).
       super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (args_1->starts).
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->starts).
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->starts).
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.elems.
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->elems).
       super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_150.elems.
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->elems).
       super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150.elems.
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->elems).
       super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_1->elems).
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->elems).
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->elems).
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.datas.
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->datas).
       super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_150.datas.
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->datas).
       super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150.datas.
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->datas).
       super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_1->datas).
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->datas).
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->datas).
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_150.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_150.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Module::Module(this_00,args,&local_150);
  local_158 = this_00;
  ref.index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
              ::New<wabt::interp::Module*>
                        ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                          *)&this->objects_,&local_158);
  ModuleDesc::~ModuleDesc(&local_150);
  RefPtr<wabt::interp::Module>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Object).self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}